

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void wipe_obj_list(void)

{
  int local_c;
  wchar_t i;
  
  num_obj = L'\0';
  num_head = L'\0';
  max_len = 0;
  ex_width = L'\0';
  ex_offset = L'\0';
  for (local_c = 0; local_c < 0x32; local_c = local_c + 1) {
    my_strcpy(items[local_c].label,"",0x50);
    my_strcpy(items[local_c].equip_label,"",0x50);
    items[local_c].object = (object *)0x0;
    my_strcpy(items[local_c].o_name,"",0x50);
    items[local_c].key = '\0';
  }
  return;
}

Assistant:

static void wipe_obj_list(void)
{
	int i;

	/* Zero the constants */
	num_obj = 0;
	num_head = 0;
	max_len = 0;
	ex_width = 0;
	ex_offset = 0;

	/* Clear the existing contents */
	for (i = 0; i < MAX_ITEMS; i++) {
		my_strcpy(items[i].label, "", sizeof(items[i].label));
		my_strcpy(items[i].equip_label, "", sizeof(items[i].equip_label));
		items[i].object = NULL;
		my_strcpy(items[i].o_name, "", sizeof(items[i].o_name));
		items[i].key = '\0';
	}
}